

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintTopLevelExtensions(Generator *this)

{
  Printer *pPVar1;
  int iVar2;
  string *__lhs;
  string local_70 [48];
  undefined1 local_40 [8];
  string constant_name;
  FieldDescriptor *extension_field;
  int i;
  bool is_extension;
  Generator *this_local;
  
  extension_field._0_4_ = 0;
  while( true ) {
    iVar2 = FileDescriptor::extension_count(this->file_);
    if (iVar2 <= (int)extension_field) break;
    constant_name.field_2._8_8_ = FileDescriptor::extension(this->file_,(int)extension_field);
    __lhs = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)constant_name.field_2._8_8_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   __lhs,"_FIELD_NUMBER");
    UpperString((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    pPVar1 = this->printer_;
    FieldDescriptor::number((FieldDescriptor *)constant_name.field_2._8_8_);
    google::protobuf::SimpleItoa_abi_cxx11_((int)local_70);
    google::protobuf::io::Printer::Print
              ((char *)pPVar1,"$constant_name$ = $number$\n",(string *)"constant_name",local_40,
               (string *)"number");
    std::__cxx11::string::~string(local_70);
    pPVar1 = this->printer_;
    FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)constant_name.field_2._8_8_);
    google::protobuf::io::Printer::Print((char *)pPVar1,"$name$ = ",(string *)0x1e3ff1);
    PrintFieldDescriptor(this,(FieldDescriptor *)constant_name.field_2._8_8_,true);
    google::protobuf::io::Printer::Print((char *)this->printer_);
    std::__cxx11::string::~string((string *)local_40);
    extension_field._0_4_ = (int)extension_field + 1;
  }
  google::protobuf::io::Printer::Print((char *)this->printer_);
  return;
}

Assistant:

void Generator::PrintTopLevelExtensions() const {
  const bool is_extension = true;
  for (int i = 0; i < file_->extension_count(); ++i) {
    const FieldDescriptor& extension_field = *file_->extension(i);
    string constant_name = extension_field.name() + "_FIELD_NUMBER";
    UpperString(&constant_name);
    printer_->Print("$constant_name$ = $number$\n",
      "constant_name", constant_name,
      "number", SimpleItoa(extension_field.number()));
    printer_->Print("$name$ = ", "name", extension_field.name());
    PrintFieldDescriptor(extension_field, is_extension);
    printer_->Print("\n");
  }
  printer_->Print("\n");
}